

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall NLReaderTest_ReadNotExpr_Test::TestBody(NLReaderTest_ReadNotExpr_Test *this)

{
  undefined1 uVar1;
  AssertionResult gtest_ar;
  undefined1 in_stack_000002d7;
  string *in_stack_000002d8;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *expected;
  char *actual_expression;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  Type in_stack_ffffffffffffff4c;
  allocator<char> *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  string local_90 [40];
  Message *in_stack_ffffffffffffff98;
  AssertHelper *in_stack_ffffffffffffffa0;
  string local_58 [32];
  string local_38 [32];
  AssertionResult local_18;
  
  actual_expression = &stack0xffffffffffffffa7;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  std::operator+(in_stack_ffffffffffffff28,
                 (char *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  expected = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff4f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  ReadNL(in_stack_000002d8,(bool)in_stack_000002d7);
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),actual_expression
             ,expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20));
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff4f);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffa7);
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!(bool)uVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff50);
    testing::AssertionResult::failure_message((AssertionResult *)0x1558d4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c,
               in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,actual_expression);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar1,in_stack_ffffffffffffff20));
    testing::Message::~Message((Message *)0x155920);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x155969);
  return;
}

Assistant:

TEST(NLReaderTest, ReadNotExpr) {
  EXPECT_READ("l0: not l0;", "L0\no34\nn0\n");
}